

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_mac.c
# Opt level: O0

void beltMACStart(void *state,octet *key,size_t len)

{
  u32 *in_RDI;
  belt_mac_st *st;
  octet *in_stack_ffffffffffffffd8;
  
  beltKeyExpand2(in_RDI,in_stack_ffffffffffffffd8,0x144161);
  in_RDI[8] = 0;
  in_RDI[9] = 0;
  in_RDI[10] = 0;
  in_RDI[0xb] = 0;
  in_RDI[0xc] = 0;
  in_RDI[0xd] = 0;
  in_RDI[0xe] = 0;
  in_RDI[0xf] = 0;
  beltBlockEncr2(in_RDI + 0xc,in_RDI);
  in_RDI[0x18] = 0;
  in_RDI[0x19] = 0;
  return;
}

Assistant:

void beltMACStart(void* state, const octet key[], size_t len)
{
	belt_mac_st* st = (belt_mac_st*)state;
	ASSERT(memIsValid(state, beltMAC_keep()));
	beltKeyExpand2(st->key, key, len);
	beltBlockSetZero(st->s);
	beltBlockSetZero(st->r);
	beltBlockEncr2(st->r, st->key);
	st->filled = 0;
}